

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

_Bool Hacl_P256_ecdsa_sign_p256_sha384
                (uint8_t *signature,uint32_t msg_len,uint8_t *msg,uint8_t *private_key,
                uint8_t *nonce)

{
  _Bool _Var1;
  uint64_t *os;
  uint8_t mHash [48];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  Hacl_Hash_SHA2_hash_384((uint8_t *)&local_58,msg,msg_len);
  local_78 = uStack_40 >> 0x38 | (uStack_40 & 0xff000000000000) >> 0x28 |
             (uStack_40 & 0xff0000000000) >> 0x18 | (uStack_40 & 0xff00000000) >> 8 |
             (uStack_40 & 0xff000000) << 8 | (uStack_40 & 0xff0000) << 0x18 |
             (uStack_40 & 0xff00) << 0x28 | uStack_40 << 0x38;
  local_70 = local_48 >> 0x38 | (local_48 & 0xff000000000000) >> 0x28 |
             (local_48 & 0xff0000000000) >> 0x18 | (local_48 & 0xff00000000) >> 8 |
             (local_48 & 0xff000000) << 8 | (local_48 & 0xff0000) << 0x18 |
             (local_48 & 0xff00) << 0x28 | local_48 << 0x38;
  local_68 = uStack_50 >> 0x38 | (uStack_50 & 0xff000000000000) >> 0x28 |
             (uStack_50 & 0xff0000000000) >> 0x18 | (uStack_50 & 0xff00000000) >> 8 |
             (uStack_50 & 0xff000000) << 8 | (uStack_50 & 0xff0000) << 0x18 |
             (uStack_50 & 0xff00) << 0x28 | uStack_50 << 0x38;
  local_60 = local_58 >> 0x38 | (local_58 & 0xff000000000000) >> 0x28 |
             (local_58 & 0xff0000000000) >> 0x18 | (local_58 & 0xff00000000) >> 8 |
             (local_58 & 0xff000000) << 8 | (local_58 & 0xff0000) << 0x18 |
             (local_58 & 0xff00) << 0x28 | local_58 << 0x38;
  qmod_short(&local_78,&local_78);
  _Var1 = ecdsa_sign_msg_as_qelem(signature,&local_78,private_key,nonce);
  return _Var1;
}

Assistant:

bool
Hacl_P256_ecdsa_sign_p256_sha384(
  uint8_t *signature,
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *private_key,
  uint8_t *nonce
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[48U] = { 0U };
  Hacl_Hash_SHA2_hash_384(mHash, msg, msg_len);
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_sign_msg_as_qelem(signature, m_q, private_key, nonce);
  return res;
}